

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall Array::setData(Array *this,int v,int x,int y)

{
  int y_local;
  int x_local;
  int v_local;
  Array *this_local;
  
  if ((((x < 0) || (this->_width <= x)) || (y < 0)) || (this->_height <= y)) {
    this_local._7_1_ = false;
  }
  else {
    this->_data[y][x] = v;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Array::setData(int v, int x, int y)
{

	if (x < 0 || x >= _width
		|| y < 0 || y >= _height)
		return false;

	_data[y][x] = v;

	return true;
}